

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

bool __thiscall
double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  undefined8 uVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong uVar4;
  byte bVar5;
  undefined4 in_register_0000000c;
  double *number_of_read_digits;
  uint uVar6;
  uint uVar7;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  DiyFp diy_fp;
  int cached_decimal_exponent;
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  int read_digits;
  undefined4 uStack_54;
  int32_t local_50;
  undefined4 uStack_4c;
  DiyFp local_48;
  long local_38;
  ulong uVar8;
  
  number_of_read_digits = (double *)CONCAT44(in_register_0000000c,exponent);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (uint)trimmed.start_;
  if (uVar7 == 0) {
LAB_00399943:
    *number_of_read_digits = 0.0;
  }
  else {
    uVar6 = trimmed.length_;
    if ((int)(uVar6 + uVar7) < 0x136) {
      if ((int)(uVar6 + uVar7) < -0x143) goto LAB_00399943;
      if (0xf < (int)uVar7) goto LAB_003998c6;
      if (uVar6 < 0xffffffea) {
        if (0x16 < uVar6) {
          if (-1 < (int)uVar6) {
            iVar9 = uVar6 - (0xf - uVar7);
            if (iVar9 < 0x17) {
              buffer_01.start_ = (char *)(ulong)uVar7;
              buffer_01._8_8_ = &local_48;
              uVar3 = ReadUint64(this,buffer_01,(int *)number_of_read_digits);
              auVar17._8_4_ = (int)(uVar3 >> 0x20);
              auVar17._0_8_ = uVar3;
              auVar17._12_4_ = 0x45300000;
              dVar14 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                       *(double *)(exact_powers_of_ten + (ulong)(0xf - uVar7) * 8);
              uVar4 = (ulong)iVar9;
              goto LAB_003998b8;
            }
          }
LAB_003998c6:
          local_48.e_ = 0;
          local_48._12_4_ = 0xaaaaaaaa;
          _read_digits = CONCAT44(uStack_54,0xaaaaaaaa);
          buffer_02.start_ = (char *)(ulong)uVar7;
          buffer_02._8_8_ = &read_digits;
          local_48.f_ = ReadUint64(this,buffer_02,(int *)number_of_read_digits);
          if (uVar7 == read_digits) {
            iVar9 = 0;
          }
          else {
            local_48.f_ = local_48.f_ + ('4' < (char)this[read_digits]);
            iVar9 = uVar7 - read_digits;
          }
          iVar11 = uVar6 + iVar9;
          DiyFp::Normalize(&local_48);
          lVar10 = ((ulong)(iVar9 != 0) << 2) << (-(char)local_48.e_ & 0x3fU);
          if (-0x15d < iVar11) {
            local_50 = 0;
            uStack_4c = 0xaaaaaaaa;
            _read_digits = 0;
            cached_decimal_exponent = -0x55555556;
            PowersOfTenCache::GetCachedPowerForDecimalExponent
                      (iVar11,(DiyFp *)&read_digits,&cached_decimal_exponent);
            iVar11 = iVar11 - cached_decimal_exponent;
            if (iVar11 != 0) {
              stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
              uVar6 = iVar11 - 1;
              if (6 < uVar6) {
                abort();
              }
              local_68._0_8_ = *(undefined8 *)(&DAT_0051feb8 + (ulong)uVar6 * 8);
              uStack_5c = 0xaaaaaaaa;
              local_68._8_4_ = *(int32_t *)(&DAT_0051fe98 + (ulong)uVar6 * 4);
              DiyFp::Multiply(&local_48,(DiyFp *)local_68);
              if ((int)(0x13 - uVar7) < iVar11) {
                lVar10 = lVar10 + 4;
              }
            }
            DiyFp::Multiply(&local_48,(DiyFp *)&read_digits);
            uVar1 = local_48._8_8_;
            DiyFp::Normalize(&local_48);
            uVar13 = (9 - (ulong)(lVar10 == 0)) + lVar10 <<
                     ((char)uVar1 - (char)local_48.e_ & 0x3fU);
            uVar4 = 0;
            if (0xfffffbce < local_48.e_ + 0x40U) {
              uVar4 = (ulong)(local_48.e_ + 0x472);
            }
            uVar8 = 0x35;
            if (local_48.e_ < -0x43d) {
              uVar8 = uVar4;
            }
            iVar9 = (int)uVar8;
            if (iVar9 < 4) {
              bVar5 = (byte)(4 - iVar9);
              local_48.f_ = local_48.f_ >> (bVar5 & 0x3f);
              uVar7 = (4 - iVar9) + local_48.e_;
              uVar8 = (ulong)uVar7;
              local_48.e_ = uVar7;
              uVar13 = (uVar13 >> (bVar5 & 0x3f)) + 9;
              iVar9 = 0x3c;
            }
            else {
              iVar9 = 0x40 - iVar9;
              uVar7 = local_48.e_;
            }
            bVar5 = (byte)iVar9;
            uVar12 = (~(-1L << (bVar5 & 0x3f)) & local_48.f_) << 3;
            lVar10 = 8L << (bVar5 - 1 & 0x3f);
            diy_fp.f_ = (ulong)(uVar7 + iVar9);
            uVar4 = uVar13 + lVar10;
            diy_fp._8_8_ = uVar8;
            dVar14 = (double)Double::DiyFpToUint64
                                       ((Double *)
                                        (((local_48.f_ >> (bVar5 & 0x3f)) + 1) -
                                        (ulong)(uVar12 < uVar4)),diy_fp);
            *number_of_read_digits = dVar14;
            bVar2 = true;
            if ((lVar10 - uVar13 < uVar12) && (uVar12 < uVar4)) {
              bVar2 = INFINITY <= dVar14;
            }
            goto LAB_00399949;
          }
          goto LAB_00399943;
        }
        buffer_00.start_ = (char *)(ulong)uVar7;
        buffer_00._8_8_ = &local_48;
        uVar3 = ReadUint64(this,buffer_00,(int *)number_of_read_digits);
        auVar16._8_4_ = (int)(uVar3 >> 0x20);
        auVar16._0_8_ = uVar3;
        auVar16._12_4_ = 0x45300000;
        dVar14 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        uVar4 = (ulong)uVar6;
LAB_003998b8:
        dVar14 = dVar14 * *(double *)(exact_powers_of_ten + uVar4 * 8);
      }
      else {
        buffer.start_ = (char *)(ulong)uVar7;
        buffer._8_8_ = &local_48;
        uVar3 = ReadUint64(this,buffer,(int *)number_of_read_digits);
        auVar15._8_4_ = (int)(uVar3 >> 0x20);
        auVar15._0_8_ = uVar3;
        auVar15._12_4_ = 0x45300000;
        dVar14 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 *(double *)(exact_powers_of_ten + (ulong)-uVar6 * 8);
      }
      *number_of_read_digits = dVar14;
    }
    else {
      *number_of_read_digits = INFINITY;
    }
  }
  bVar2 = true;
LAB_00399949:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}